

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_make_context(sexp ctx,size_t size,size_t max_size)

{
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  
  res = (sexp)&DAT_0000043e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  if (ctx == (sexp)0x0) {
    res = sexp_bootstrap_context(size,max_size);
    if (res == (sexp)0x0) {
      return (sexp)0x0;
    }
    if ((((ulong)res & 3) == 0) && (res->tag == 0x13)) {
      return res;
    }
  }
  else {
    __sexp_gc_preserver1.var = &res;
    __sexp_gc_preserver1.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &__sexp_gc_preserver1;
    res = sexp_alloc_tagged_aux(ctx,0x60c8,0x24);
    (res->value).type.finalize = (ctx->value).type.finalize;
  }
  if ((((ulong)res & 3) != 0) || (res->tag != 0x13)) {
    (res->value).context.gc_usecs = 0;
    (res->value).type.slots = ctx;
    (res->value).port.size = 0x3e;
    (res->value).port.flags = 0x3e;
    (res->value).context.mark_stack_ptr = (sexp_mark_stack_ptr_t *)0x0;
    (res->value).context.saves = (sexp_gc_var_t *)0x0;
    (res->value).port.offset = 0x23e;
    (res->value).flonum_bits[0x60a2] = '\0';
    (res->value).context.last_fp = 0;
    (res->value).context.gc_count = 0;
    *(undefined2 *)((long)&res->value + 0x60a0) = 1;
    (res->value).flonum_bits[0x60a4] = '\0';
    (res->value).opcode.dl = (sexp)0x3e;
    (res->value).context.refuel = 500;
    if (ctx == (sexp)0x0) {
      (res->value).opcode.func = (sexp_proc1)0x3e;
      sexp_init_context_globals(res);
    }
    else {
      (res->value).opcode.func = (ctx->value).opcode.func;
      (res->value).type.setters = (ctx->value).type.setters;
      (res->value).type.id = (ctx->value).type.id;
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
    }
  }
  return res;
}

Assistant:

sexp sexp_make_context (sexp ctx, size_t size, size_t max_size) {
  sexp_gc_var1(res);
  if (ctx) sexp_gc_preserve1(ctx, res);
#if ! SEXP_USE_GLOBAL_HEAP
  if (! ctx) {
    res = sexp_bootstrap_context(size, max_size);
    if (!res || sexp_exceptionp(res)) return res;
  } else
#endif
    {
      res = sexp_alloc_type(ctx, context, SEXP_CONTEXT);
#if ! SEXP_USE_BOEHM && ! SEXP_USE_MALLOC
      sexp_context_heap(res) = sexp_context_heap(ctx);
#endif
    }
  if (!res || sexp_exceptionp(res)) return res;
  sexp_context_parent(res) = ctx;
  sexp_context_name(res) = sexp_context_specific(res) = SEXP_FALSE;
  sexp_context_mark_stack_ptr(res) = NULL;
  sexp_context_saves(res) = NULL;
  sexp_context_params(res) = SEXP_NULL;
  sexp_context_last_fp(res) = 0;
#if SEXP_USE_TIME_GC
  sexp_context_gc_count(res) = 0;
  sexp_context_gc_usecs(res) = 0;
#endif
#if SEXP_USE_TRACK_ALLOC_TIMES
  sexp_context_alloc_count(res) = 0;
  sexp_context_alloc_usecs(res) = 0;
  sexp_context_alloc_usecs_sq(res) = 0;
#endif
  sexp_context_tracep(res) = 0;
  sexp_context_timeoutp(res) = 0;
  sexp_context_tailp(res) = 1;
#if SEXP_USE_GREEN_THREADS
  sexp_context_errorp(res) = 0;
  sexp_context_event(res) = SEXP_FALSE;
  sexp_context_refuel(res) = SEXP_DEFAULT_QUANTUM;
#endif
#if SEXP_USE_DL
  sexp_context_dl(res) = ctx ? sexp_context_dl(ctx) : SEXP_FALSE;
#endif
  if (ctx) {
    sexp_context_globals(res) = sexp_context_globals(ctx);
    sexp_context_dk(res) = sexp_context_dk(ctx);
    sexp_gc_release1(ctx);
  } else {
    sexp_init_context_globals(res);
  }
  return res;
}